

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

char * attr_string_from_atom(atom_t atom)

{
  char *pcVar1;
  undefined4 in_register_0000003c;
  atom_server *asp;
  
  asp = (atom_server *)CONCAT44(in_register_0000003c,atom);
  if (global_as_lock != (atl_lock_func)0x0) {
    asp = (atom_server *)global_as_lock_data;
    (*global_as_lock)(global_as_lock_data);
  }
  init_global_atom_server(asp);
  pcVar1 = string_from_atom(global_as,atom);
  if (global_as_unlock != (atl_lock_func)0x0) {
    (*global_as_unlock)(global_as_lock_data);
  }
  return pcVar1;
}

Assistant:

extern
char *
attr_string_from_atom(atom_t atom)
{
    char *tmp;
    atl_lock();
    init_global_atom_server(&global_as);
    tmp = string_from_atom(global_as, atom);
    atl_unlock();
    return tmp;
}